

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfw_main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  GLFWwindow *handle;
  ostream *poVar2;
  LumeviewError *this;
  allocator local_1c9;
  int frmBufHeight;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c0 [3];
  int frmBufWidth;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  ostream local_198 [376];
  
  glfwSetErrorCallback(HandleGLFWError);
  glfwInit();
  glfwWindowHint(0x22002,3);
  glfwWindowHint(0x22003,3);
  glfwWindowHint(0x22008,0x32001);
  handle = glfwCreateWindow(800,600,"lumeview",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle != (GLFWwindow *)0x0) {
    glfwMakeContextCurrent(handle);
    glfwSwapInterval(1);
    lumeview::LumeviewInit();
    if (argc == 2) {
      std::__cxx11::string::string((string *)&frmBufWidth,argv[1],&local_1c9);
      lumeview::CreateSceneForMesh((string *)&frmBufHeight);
      lumeview::Lumeview::set_scene(&g_lumeview,(SPScene *)&frmBufHeight);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1c0);
      std::__cxx11::string::~string((string *)&frmBufWidth);
    }
    else {
      lumeview::CreateSampleScene();
      lumeview::Lumeview::set_scene(&g_lumeview,(SPScene *)&frmBufWidth);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a0);
    }
    InitImGui(handle);
    glfwSetCursorPosCallback(handle,CursorPositionCallback);
    glfwSetMouseButtonCallback(handle,MouseButtonCallback);
    glfwSetScrollCallback(handle,ScrollCallback);
    glfwSetKeyCallback(handle,KeyCallback);
    glfwSetCharCallback(handle,CharCallback);
    glfwGetFramebufferSize(handle,&frmBufWidth,&frmBufHeight);
    FramebufferResized(handle,frmBufWidth,frmBufHeight);
    glfwSetFramebufferSizeCallback(handle,FramebufferResized);
    while( true ) {
      iVar1 = glfwWindowShouldClose(handle);
      if (iVar1 != 0) break;
      lumeview::Lumeview::process_gui(&g_lumeview);
      lumeview::Lumeview::render(&g_lumeview);
      glfwSwapBuffers(handle);
      glfwPollEvents();
    }
    lumeview::Lumeview::clear(&g_lumeview);
    lumeview::LumeviewShutdown();
    glfwTerminate();
    return 0;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&frmBufWidth);
  poVar2 = std::operator<<(local_198,"GLFW::INIT\n");
  std::operator<<(poVar2,"Failed to create glfw window");
  this = (LumeviewError *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  lumeview::LumeviewError::LumeviewError(this,(string *)&frmBufHeight);
  __cxa_throw(this,&lumeview::LumeviewError::typeinfo,lumeview::LumeviewError::~LumeviewError);
}

Assistant:

int main (int argc, char** argv)
{
	int retVal = 0;

	try {
		glfwSetErrorCallback (HandleGLFWError);
		glfwInit ();
		glfwWindowHint (GLFW_CONTEXT_VERSION_MAJOR, USE_GL_VERSION_MAJOR);
		glfwWindowHint (GLFW_CONTEXT_VERSION_MINOR, USE_GL_VERSION_MINOR);
		if((USE_GL_VERSION_MAJOR >= 3) && (USE_GL_VERSION_MINOR >= 2))
			glfwWindowHint (GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

	//	add for OSX:
		#ifdef __APPLE__
			glfwWindowHint (GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
		#endif

	//	Set up window
		GLFWwindow* window = glfwCreateWindow (800, 600, "lumeview", NULL, NULL);
		COND_THROW (window == NULL, "GLFW::INIT\n" <<
		            "Failed to create glfw window");

		glfwMakeContextCurrent (window);
		glfwSwapInterval(1);

		LumeviewInit ();
		
	//	if a filename was specified, we'll load that, if not, we'll create a sample scene
		if (argc == 2)
			g_lumeview.set_scene (CreateSceneForMesh (argv[1]));
		else
			g_lumeview.set_scene (CreateSampleScene ());

	    InitImGui (window);

	    glfwSetCursorPosCallback (window, CursorPositionCallback);
	    glfwSetMouseButtonCallback (window, MouseButtonCallback);
	    glfwSetScrollCallback (window, ScrollCallback);
	    glfwSetKeyCallback (window, KeyCallback);
	    glfwSetCharCallback (window, CharCallback);

	//	setup view
	    int frmBufWidth, frmBufHeight;
	    glfwGetFramebufferSize (window, &frmBufWidth, &frmBufHeight);
		FramebufferResized (window, frmBufWidth, frmBufHeight);
		glfwSetFramebufferSizeCallback (window, FramebufferResized);

		while (!glfwWindowShouldClose (window))
		{
			g_lumeview.process_gui ();
			g_lumeview.render ();
			
			glfwSwapBuffers (window);
			glfwPollEvents ();
		}

	} catch (FileNotFoundError& e) {
		cout << "\nAn ERROR occurred during execution:\n";
		cout << "File not found: " << e.what() << endl << endl;
		retVal = 1;
	}
	catch (std::exception& e) {
		cout << "\nAn ERROR occurred during execution:\n";
		cout << e.what() << endl << endl;
		retVal = 1;
	}

	g_lumeview.clear();
	lumeview::LumeviewShutdown ();
	glfwTerminate ();
	return retVal;
}